

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void runsign(runcxdef *ctx,int err)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(*(long *)(in_RDI + 0x68) + 0x28) != 0) {
    iVar1 = dbgu_err_resume(*(dbgcxdef **)(in_RDI + 0x68));
    if (iVar1 != 0) goto LAB_00289e76;
  }
  dbgss(*(dbgcxdef **)(in_RDI + 0x68),*(uint *)(in_RDI + 0x94),0x4e,in_ESI,(uchar **)0x0);
LAB_00289e76:
  errsign((errcxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
          &UNK_00289e8e);
}

Assistant:

NORETURN void runsign(runcxdef *ctx, int err)
{
    /*
     *   If the debugger isn't capable of resuming from a run-time error,
     *   trap to the debugger now so that the user can see what happened.
     *   Do not trap to the debugger here if the debugger can resume from
     *   an error; instead, we'll trap in the p-code loop, since we'll be
     *   able to resume execution from the point of the error.
     *   
     *   Note that we can't resume from an error when there's no stack
     *   frame, so we'll trap to the debugger here in that case.  
     */
    if (ctx->runcxdbg->dbgcxfcn == 0
        || !dbgu_err_resume(ctx->runcxdbg))
        dbgssi(ctx->runcxdbg, ctx->runcxlofs, OPCLINE, err, 0);

    /* signal the error */
    errsign(ctx->runcxerr, err, "TADS");
}